

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cnfMap.c
# Opt level: O0

void Cnf_CutAssignAreaFlow(Cnf_Man_t *p,Dar_Cut_t *pCut,int *pAreaFlows)

{
  int iVar1;
  Aig_Obj_t *pObj;
  uint local_38;
  int local_2c;
  int i;
  Aig_Obj_t *pLeaf;
  int *pAreaFlows_local;
  Dar_Cut_t *pCut_local;
  Cnf_Man_t *p_local;
  
  *(uint *)&pCut->field_0x4 = *(uint *)&pCut->field_0x4 & 0xf800ffff;
  iVar1 = Cnf_CutSopCost(p,pCut);
  pCut->uSign = iVar1 * 10;
  local_2c = 0;
  do {
    if ((int)(*(uint *)&pCut->field_0x4 >> 0x1d) <= local_2c) {
      return;
    }
    pObj = Aig_ManObj(p->pManAig,pCut->pLeaves[local_2c]);
    *(uint *)&pCut->field_0x4 =
         *(uint *)&pCut->field_0x4 & 0xf800ffff |
         ((*(uint *)&pCut->field_0x4 >> 0x10 & 0x7ff) +
          ((uint)(*(ulong *)&pObj->field_0x18 >> 6) & 0x3ffffff) & 0x7ff) << 0x10;
    iVar1 = Aig_ObjIsNode(pObj);
    if (iVar1 != 0) {
      if ((*(ulong *)&pObj->field_0x18 >> 6 & 0x3ffffff) == 0) {
        __assert_fail("pLeaf->nRefs > 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/sat/cnf/cnfMap.c"
                      ,0x39,"void Cnf_CutAssignAreaFlow(Cnf_Man_t *, Dar_Cut_t *, int *)");
      }
      if ((*(ulong *)&pObj->field_0x18 >> 6 & 0x3ffffff) == 0) {
        local_38 = 1;
      }
      else {
        local_38 = (uint)(*(ulong *)&pObj->field_0x18 >> 6) & 0x3ffffff;
      }
      pCut->uSign = pAreaFlows[pObj->Id] / (int)local_38 + pCut->uSign;
    }
    local_2c = local_2c + 1;
  } while( true );
}

Assistant:

ABC_NAMESPACE_IMPL_START


////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    [Computes area flow of the cut.]

  Description []
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
void Cnf_CutAssignAreaFlow( Cnf_Man_t * p, Dar_Cut_t * pCut, int * pAreaFlows )
{
    Aig_Obj_t * pLeaf;
    int i;
    pCut->Value = 0;
//    pCut->uSign = 100 * Cnf_CutSopCost( p, pCut );
    pCut->uSign = 10 * Cnf_CutSopCost( p, pCut );
    Dar_CutForEachLeaf( p->pManAig, pCut, pLeaf, i )
    {
        pCut->Value += pLeaf->nRefs;
        if ( !Aig_ObjIsNode(pLeaf) )
            continue;
        assert( pLeaf->nRefs > 0 );
        pCut->uSign += pAreaFlows[pLeaf->Id] / (pLeaf->nRefs? pLeaf->nRefs : 1);
    }
}